

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmm.c
# Opt level: O0

int32 hmm_vit_eval_5st_lr_mpx(hmm_t *hmm)

{
  int *piVar1;
  int32 *piVar2;
  s3senid_t **ppsVar3;
  int *piVar4;
  int iVar5;
  int local_58;
  int local_54;
  int32 t0;
  int32 t1;
  int32 t2;
  int32 s0;
  int32 s1;
  int32 s2;
  int32 s3;
  int32 s4;
  int32 s5;
  int32 bestScore;
  int32 *ssid;
  s3senid_t **sseq;
  int32 *senscore;
  int32 *tp;
  hmm_t *hmm_local;
  
  piVar1 = *hmm->ctx->tp[hmm->tmatid];
  piVar2 = hmm->ctx->senscore;
  ppsVar3 = hmm->ctx->sseq;
  piVar4 = (hmm->s).mpx_ssid;
  if (piVar4[4] == -1) {
    local_54 = -0x38000000;
    s2 = -0x38000000;
  }
  else {
    s2 = hmm->state[4].score + piVar2[ppsVar3[piVar4[4]][4]];
    local_54 = s2 + piVar1[0x1d];
  }
  if (piVar4[3] == -1) {
    t0 = -0x38000000;
    s1 = -0x38000000;
  }
  else {
    s1 = hmm->state[3].score + piVar2[ppsVar3[piVar4[3]][3]];
    t0 = s1 + piVar1[0x17];
  }
  if (t0 < local_54) {
    s3 = local_54;
    (hmm->out).history = hmm->state[4].history;
  }
  else {
    s3 = t0;
    (hmm->out).history = hmm->state[3].history;
  }
  if (s3 < -0x38000000) {
    s3 = -0x38000000;
  }
  (hmm->out).score = s3;
  s4 = s3;
  if (piVar4[2] == -1) {
    t0 = -0x38000000;
    s0 = -0x38000000;
  }
  else {
    s0 = hmm->state[2].score + piVar2[ppsVar3[piVar4[2]][2]];
    t0 = s0 + piVar1[0x10];
  }
  local_54 = -0x38000000;
  local_58 = -0x38000000;
  if (s2 != -0x38000000) {
    local_58 = s2 + piVar1[0x1c];
  }
  if (s1 != -0x38000000) {
    local_54 = s1 + piVar1[0x16];
  }
  if (local_54 < local_58) {
    if (local_58 < t0) {
      s2 = t0;
      hmm->state[4].history = hmm->state[2].history;
      piVar4[4] = piVar4[2];
    }
    else {
      s2 = local_58;
    }
  }
  else if (local_54 < t0) {
    s2 = t0;
    hmm->state[4].history = hmm->state[2].history;
    piVar4[4] = piVar4[2];
  }
  else {
    s2 = local_54;
    hmm->state[4].history = hmm->state[3].history;
    piVar4[4] = piVar4[3];
  }
  if (s2 < -0x38000000) {
    s2 = -0x38000000;
  }
  if (s3 < s2) {
    s4 = s2;
  }
  hmm->state[4].score = s2;
  if (piVar4[1] == -1) {
    t0 = -0x38000000;
    t2 = -0x38000000;
  }
  else {
    t2 = hmm->state[1].score + piVar2[ppsVar3[piVar4[1]][1]];
    t0 = t2 + piVar1[9];
  }
  local_54 = -0x38000000;
  local_58 = -0x38000000;
  if (s1 != -0x38000000) {
    local_58 = s1 + piVar1[0x15];
  }
  if (s0 != -0x38000000) {
    local_54 = s0 + piVar1[0xf];
  }
  if (local_54 < local_58) {
    if (local_58 < t0) {
      s1 = t0;
      hmm->state[3].history = hmm->state[1].history;
      piVar4[3] = piVar4[1];
    }
    else {
      s1 = local_58;
    }
  }
  else if (local_54 < t0) {
    s1 = t0;
    hmm->state[3].history = hmm->state[1].history;
    piVar4[3] = piVar4[1];
  }
  else {
    s1 = local_54;
    hmm->state[3].history = hmm->state[2].history;
    piVar4[3] = piVar4[2];
  }
  if (s1 < -0x38000000) {
    s1 = -0x38000000;
  }
  if (s4 < s1) {
    s4 = s1;
  }
  hmm->state[3].score = s1;
  iVar5 = hmm->state[0].score + piVar2[*ppsVar3[*piVar4]];
  local_54 = -0x38000000;
  local_58 = -0x38000000;
  if (s0 != -0x38000000) {
    local_58 = s0 + piVar1[0xe];
  }
  if (t2 != -0x38000000) {
    local_54 = t2 + piVar1[8];
  }
  s0 = iVar5 + piVar1[2];
  if (local_54 < local_58) {
    if (local_58 < s0) {
      hmm->state[2].history = hmm->state[0].history;
      piVar4[2] = *piVar4;
    }
    else {
      s0 = local_58;
    }
  }
  else if (local_54 < s0) {
    hmm->state[2].history = hmm->state[0].history;
    piVar4[2] = *piVar4;
  }
  else {
    s0 = local_54;
    hmm->state[2].history = hmm->state[1].history;
    piVar4[2] = piVar4[1];
  }
  if (s0 < -0x38000000) {
    s0 = -0x38000000;
  }
  if (s4 < s0) {
    s4 = s0;
  }
  hmm->state[2].score = s0;
  local_58 = -0x38000000;
  if (t2 != -0x38000000) {
    local_58 = t2 + piVar1[7];
  }
  t2 = iVar5 + piVar1[1];
  if (t2 < local_58) {
    t2 = local_58;
  }
  else {
    hmm->state[1].history = hmm->state[0].history;
    piVar4[1] = *piVar4;
  }
  if (t2 < -0x38000000) {
    t2 = -0x38000000;
  }
  if (s4 < t2) {
    s4 = t2;
  }
  hmm->state[1].score = t2;
  t1 = *piVar1 + iVar5;
  if (t1 < -0x38000000) {
    t1 = -0x38000000;
  }
  if (s4 < t1) {
    s4 = t1;
  }
  hmm->state[0].score = t1;
  hmm->bestscore = s4;
  return s4;
}

Assistant:

static int32
hmm_vit_eval_5st_lr_mpx(hmm_t * hmm)
{
    const int32 *tp = hmm->ctx->tp[hmm->tmatid][0];
    const int32 *senscore = hmm->ctx->senscore;
    const s3senid_t **sseq = hmm->ctx->sseq;
    int32 *ssid = hmm->s.mpx_ssid;
    int32 bestScore;
    int32 s5, s4, s3, s2, s1, s0, t2, t1, t0;

    /* Don't propagate WORST_SCORE */
    if (ssid[4] == -1)
        s4 = t1 = WORST_SCORE;
    else {
        s4 = hmm_score(hmm, 4) + mpx_senscr(4);
        t1 = s4 + hmm_tprob_5st(4, 5);
    }
    if (ssid[3] == -1)
        s3 = t2 = WORST_SCORE;
    else {
        s3 = hmm_score(hmm, 3) + mpx_senscr(3);
        t2 = s3 + hmm_tprob_5st(3, 5);
    }
    if (t1 > t2) {
        s5 = t1;
        hmm_out_history(hmm) = hmm_history(hmm, 4);
    }
    else {
        s5 = t2;
        hmm_out_history(hmm) = hmm_history(hmm, 3);
    }
    if (s5 < WORST_SCORE) s5 = WORST_SCORE;
    hmm_out_score(hmm) = s5;
    bestScore = s5;

    /* Don't propagate WORST_SCORE */
    if (ssid[2] == -1)
        s2 = t2 = WORST_SCORE;
    else {
        s2 = hmm_score(hmm, 2) + mpx_senscr(2);
        t2 = s2 + hmm_tprob_5st(2, 4);
    }

    t0 = t1 = WORST_SCORE;
    if (s4 != WORST_SCORE)
        t0 = s4 + hmm_tprob_5st(4, 4);
    if (s3 != WORST_SCORE)
        t1 = s3 + hmm_tprob_5st(3, 4);
    if (t0 > t1) {
        if (t2 > t0) {
            s4 = t2;
            hmm_history(hmm, 4) = hmm_history(hmm, 2);
            ssid[4] = ssid[2];
        }
        else
            s4 = t0;
    }
    else {
        if (t2 > t1) {
            s4 = t2;
            hmm_history(hmm, 4) = hmm_history(hmm, 2);
            ssid[4] = ssid[2];
        }
        else {
            s4 = t1;
            hmm_history(hmm, 4) = hmm_history(hmm, 3);
            ssid[4] = ssid[3];
        }
    }
    if (s4 < WORST_SCORE) s4 = WORST_SCORE;
    if (s4 > bestScore)
        bestScore = s4;
    hmm_score(hmm, 4) = s4;

    /* Don't propagate WORST_SCORE */
    if (ssid[1] == -1)
        s1 = t2 = WORST_SCORE;
    else {
        s1 = hmm_score(hmm, 1) + mpx_senscr(1);
        t2 = s1 + hmm_tprob_5st(1, 3);
    }
    t0 = t1 = WORST_SCORE;
    if (s3 != WORST_SCORE)
        t0 = s3 + hmm_tprob_5st(3, 3);
    if (s2 != WORST_SCORE)
        t1 = s2 + hmm_tprob_5st(2, 3);
    if (t0 > t1) {
        if (t2 > t0) {
            s3 = t2;
            hmm_history(hmm, 3) = hmm_history(hmm, 1);
            ssid[3] = ssid[1];
        }
        else
            s3 = t0;
    }
    else {
        if (t2 > t1) {
            s3 = t2;
            hmm_history(hmm, 3) = hmm_history(hmm, 1);
            ssid[3] = ssid[1];
        }
        else {
            s3 = t1;
            hmm_history(hmm, 3) = hmm_history(hmm, 2);
            ssid[3] = ssid[2];
        }
    }
    if (s3 < WORST_SCORE) s3 = WORST_SCORE;
    if (s3 > bestScore) bestScore = s3;
    hmm_score(hmm, 3) = s3;

    /* State 0 is always active */
    s0 = hmm_in_score(hmm) + mpx_senscr(0);

    /* Don't propagate WORST_SCORE */
    t0 = t1 = WORST_SCORE;
    if (s2 != WORST_SCORE)
        t0 = s2 + hmm_tprob_5st(2, 2);
    if (s1 != WORST_SCORE)
        t1 = s1 + hmm_tprob_5st(1, 2);
    t2 = s0 + hmm_tprob_5st(0, 2);
    if (t0 > t1) {
        if (t2 > t0) {
            s2 = t2;
            hmm_history(hmm, 2) = hmm_in_history(hmm);
            ssid[2] = ssid[0];
        }
        else
            s2 = t0;
    }
    else {
        if (t2 > t1) {
            s2 = t2;
            hmm_history(hmm, 2) = hmm_in_history(hmm);
            ssid[2] = ssid[0];
        }
        else {
            s2 = t1;
            hmm_history(hmm, 2) = hmm_history(hmm, 1);
            ssid[2] = ssid[1];
        }
    }
    if (s2 < WORST_SCORE) s2 = WORST_SCORE;
    if (s2 > bestScore) bestScore = s2;
    hmm_score(hmm, 2) = s2;

    /* Don't propagate WORST_SCORE */
    t0 = WORST_SCORE;
    if (s1 != WORST_SCORE)
        t0 = s1 + hmm_tprob_5st(1, 1);
    t1 = s0 + hmm_tprob_5st(0, 1);
    if (t0 > t1) {
        s1 = t0;
    }
    else {
        s1 = t1;
        hmm_history(hmm, 1) = hmm_in_history(hmm);
        ssid[1] = ssid[0];
    }
    if (s1 < WORST_SCORE) s1 = WORST_SCORE;
    if (s1 > bestScore) bestScore = s1;
    hmm_score(hmm, 1) = s1;

    s0 += hmm_tprob_5st(0, 0);
    if (s0 < WORST_SCORE) s0 = WORST_SCORE;
    if (s0 > bestScore) bestScore = s0;
    hmm_in_score(hmm) = s0;

    hmm_bestscore(hmm) = bestScore;
    return bestScore;
}